

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O3

bool __thiscall AllDiffDomain<0>::propagate(AllDiffDomain<0> *this)

{
  IntView<0> *pIVar1;
  Node *pNVar2;
  IntVar *pIVar3;
  Node *pNVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  Node *pNVar8;
  ulong uVar9;
  Node *pNVar10;
  bool *pbVar11;
  long lVar12;
  uint uVar13;
  int *pt;
  Tint *pTVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar33;
  undefined1 auVar30 [16];
  int iVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar69;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar70;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar71;
  int iVar84;
  int iVar85;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  TrailElem local_50;
  Node *local_40;
  undefined8 local_38;
  
  local_40 = (Node *)&this->queue;
  local_38 = 0x210f60;
LAB_00157a30:
  this->queue_tail = &local_40->next;
  iVar84 = this->sz;
  pNVar8 = local_40;
  if (0 < iVar84) {
    pNVar10 = this->var_nodes;
    lVar12 = 0;
    do {
      if ((pNVar10->match).v < 0) {
        pNVar8->next = (int)lVar12;
        this->queue_tail = &pNVar10->next;
        iVar84 = this->sz;
        pNVar8 = pNVar10;
      }
      lVar12 = lVar12 + 1;
      pNVar10 = pNVar10 + 1;
    } while (lVar12 < iVar84);
  }
  pNVar8->next = -1;
  auVar95 = _DAT_001d4970;
  iVar84 = this->range;
  if (0 < (long)iVar84) {
    pNVar8 = this->val_nodes;
    lVar12 = (long)iVar84 + -1;
    auVar16._8_4_ = (int)lVar12;
    auVar16._0_8_ = lVar12;
    auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
    lVar12 = 0;
    auVar46 = _DAT_001d4960;
    auVar55 = _DAT_001d8190;
    auVar59 = _DAT_001d8690;
    auVar77 = _DAT_001d8680;
    auVar22 = _DAT_001d8670;
    auVar24 = _DAT_001d8660;
    auVar26 = _DAT_001d8650;
    auVar28 = _DAT_001d8640;
    do {
      auVar30 = auVar16 ^ auVar95;
      auVar35 = auVar46 ^ auVar95;
      iVar69 = auVar30._0_4_;
      iVar71 = -(uint)(iVar69 < auVar35._0_4_);
      iVar70 = auVar30._4_4_;
      auVar36._4_4_ = -(uint)(iVar70 < auVar35._4_4_);
      iVar33 = auVar30._8_4_;
      iVar85 = -(uint)(iVar33 < auVar35._8_4_);
      iVar34 = auVar30._12_4_;
      auVar36._12_4_ = -(uint)(iVar34 < auVar35._12_4_);
      auVar48._4_4_ = iVar71;
      auVar48._0_4_ = iVar71;
      auVar48._8_4_ = iVar85;
      auVar48._12_4_ = iVar85;
      auVar86 = pshuflw(in_XMM13,auVar48,0xe8);
      auVar30._4_4_ = -(uint)(auVar35._4_4_ == iVar70);
      auVar30._12_4_ = -(uint)(auVar35._12_4_ == iVar34);
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar91 = pshuflw(in_XMM14,auVar30,0xe8);
      auVar36._0_4_ = auVar36._4_4_;
      auVar36._8_4_ = auVar36._12_4_;
      auVar35 = pshuflw(auVar86,auVar36,0xe8);
      auVar92._8_4_ = 0xffffffff;
      auVar92._0_8_ = 0xffffffffffffffff;
      auVar92._12_4_ = 0xffffffff;
      auVar35 = (auVar35 | auVar91 & auVar86) ^ auVar92;
      auVar35 = packssdw(auVar35,auVar35);
      if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (&pNVar8->mark)[lVar12] = false;
      }
      auVar36 = auVar30 & auVar48 | auVar36;
      auVar30 = packssdw(auVar36,auVar36);
      auVar30 = packssdw(auVar30 ^ auVar92,auVar30 ^ auVar92);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30._0_4_ >> 8 & 1) != 0) {
        (&pNVar8[1].mark)[lVar12] = false;
      }
      auVar30 = auVar55 ^ auVar95;
      iVar71 = -(uint)(iVar69 < auVar30._0_4_);
      auVar91._4_4_ = -(uint)(iVar70 < auVar30._4_4_);
      iVar85 = -(uint)(iVar33 < auVar30._8_4_);
      auVar91._12_4_ = -(uint)(iVar34 < auVar30._12_4_);
      auVar35._4_4_ = iVar71;
      auVar35._0_4_ = iVar71;
      auVar35._8_4_ = iVar85;
      auVar35._12_4_ = iVar85;
      auVar86._4_4_ = -(uint)(auVar30._4_4_ == iVar70);
      auVar86._12_4_ = -(uint)(auVar30._12_4_ == iVar34);
      auVar86._0_4_ = auVar86._4_4_;
      auVar86._8_4_ = auVar86._12_4_;
      auVar91._0_4_ = auVar91._4_4_;
      auVar91._8_4_ = auVar91._12_4_;
      auVar30 = auVar86 & auVar35 | auVar91;
      auVar30 = packssdw(auVar30,auVar30);
      auVar30 = packssdw(auVar30 ^ auVar92,auVar30 ^ auVar92);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30._0_4_ >> 0x10 & 1) != 0) {
        (&pNVar8[2].mark)[lVar12] = false;
      }
      auVar35 = pshufhw(auVar35,auVar35,0x84);
      auVar48 = pshufhw(auVar86,auVar86,0x84);
      auVar36 = pshufhw(auVar35,auVar91,0x84);
      auVar35 = (auVar36 | auVar48 & auVar35) ^ auVar92;
      auVar35 = packssdw(auVar35,auVar35);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35._0_4_ >> 0x18 & 1) != 0) {
        (&pNVar8[3].mark)[lVar12] = false;
      }
      auVar35 = auVar59 ^ auVar95;
      iVar71 = -(uint)(iVar69 < auVar35._0_4_);
      auVar38._4_4_ = -(uint)(iVar70 < auVar35._4_4_);
      iVar85 = -(uint)(iVar33 < auVar35._8_4_);
      auVar38._12_4_ = -(uint)(iVar34 < auVar35._12_4_);
      auVar49._4_4_ = iVar71;
      auVar49._0_4_ = iVar71;
      auVar49._8_4_ = iVar85;
      auVar49._12_4_ = iVar85;
      auVar30 = pshuflw(auVar30,auVar49,0xe8);
      auVar37._4_4_ = -(uint)(auVar35._4_4_ == iVar70);
      auVar37._12_4_ = -(uint)(auVar35._12_4_ == iVar34);
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar36 = pshuflw(auVar92,auVar37,0xe8);
      auVar38._0_4_ = auVar38._4_4_;
      auVar38._8_4_ = auVar38._12_4_;
      auVar35 = pshuflw(auVar30,auVar38,0xe8);
      auVar93._8_4_ = 0xffffffff;
      auVar93._0_8_ = 0xffffffffffffffff;
      auVar93._12_4_ = 0xffffffff;
      auVar30 = (auVar35 | auVar36 & auVar30) ^ auVar93;
      auVar30 = packssdw(auVar30,auVar30);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        (&pNVar8[4].mark)[lVar12] = false;
      }
      auVar38 = auVar37 & auVar49 | auVar38;
      auVar30 = packssdw(auVar38,auVar38);
      auVar30 = packssdw(auVar30 ^ auVar93,auVar30 ^ auVar93);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30._4_2_ >> 8 & 1) != 0) {
        (&pNVar8[5].mark)[lVar12] = false;
      }
      auVar30 = auVar77 ^ auVar95;
      iVar71 = -(uint)(iVar69 < auVar30._0_4_);
      auVar72._4_4_ = -(uint)(iVar70 < auVar30._4_4_);
      iVar85 = -(uint)(iVar33 < auVar30._8_4_);
      auVar72._12_4_ = -(uint)(iVar34 < auVar30._12_4_);
      auVar39._4_4_ = iVar71;
      auVar39._0_4_ = iVar71;
      auVar39._8_4_ = iVar85;
      auVar39._12_4_ = iVar85;
      auVar50._4_4_ = -(uint)(auVar30._4_4_ == iVar70);
      auVar50._12_4_ = -(uint)(auVar30._12_4_ == iVar34);
      auVar50._0_4_ = auVar50._4_4_;
      auVar50._8_4_ = auVar50._12_4_;
      auVar72._0_4_ = auVar72._4_4_;
      auVar72._8_4_ = auVar72._12_4_;
      auVar30 = auVar50 & auVar39 | auVar72;
      auVar30 = packssdw(auVar30,auVar30);
      auVar30 = packssdw(auVar30 ^ auVar93,auVar30 ^ auVar93);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        (&pNVar8[6].mark)[lVar12] = false;
      }
      auVar35 = pshufhw(auVar39,auVar39,0x84);
      auVar48 = pshufhw(auVar50,auVar50,0x84);
      auVar36 = pshufhw(auVar35,auVar72,0x84);
      auVar35 = (auVar36 | auVar48 & auVar35) ^ auVar93;
      auVar35 = packssdw(auVar35,auVar35);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35._6_2_ >> 8 & 1) != 0) {
        (&pNVar8[7].mark)[lVar12] = false;
      }
      auVar35 = auVar22 ^ auVar95;
      iVar71 = -(uint)(iVar69 < auVar35._0_4_);
      auVar41._4_4_ = -(uint)(iVar70 < auVar35._4_4_);
      iVar85 = -(uint)(iVar33 < auVar35._8_4_);
      auVar41._12_4_ = -(uint)(iVar34 < auVar35._12_4_);
      auVar51._4_4_ = iVar71;
      auVar51._0_4_ = iVar71;
      auVar51._8_4_ = iVar85;
      auVar51._12_4_ = iVar85;
      auVar30 = pshuflw(auVar30,auVar51,0xe8);
      auVar40._4_4_ = -(uint)(auVar35._4_4_ == iVar70);
      auVar40._12_4_ = -(uint)(auVar35._12_4_ == iVar34);
      auVar40._0_4_ = auVar40._4_4_;
      auVar40._8_4_ = auVar40._12_4_;
      auVar36 = pshuflw(auVar93,auVar40,0xe8);
      auVar41._0_4_ = auVar41._4_4_;
      auVar41._8_4_ = auVar41._12_4_;
      auVar35 = pshuflw(auVar30,auVar41,0xe8);
      auVar94._8_4_ = 0xffffffff;
      auVar94._0_8_ = 0xffffffffffffffff;
      auVar94._12_4_ = 0xffffffff;
      auVar30 = (auVar35 | auVar36 & auVar30) ^ auVar94;
      auVar30 = packssdw(auVar30,auVar30);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (&pNVar8[8].mark)[lVar12] = false;
      }
      auVar41 = auVar40 & auVar51 | auVar41;
      auVar30 = packssdw(auVar41,auVar41);
      auVar30 = packssdw(auVar30 ^ auVar94,auVar30 ^ auVar94);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30._8_2_ >> 8 & 1) != 0) {
        (&pNVar8[9].mark)[lVar12] = false;
      }
      auVar30 = auVar24 ^ auVar95;
      iVar71 = -(uint)(iVar69 < auVar30._0_4_);
      auVar73._4_4_ = -(uint)(iVar70 < auVar30._4_4_);
      iVar85 = -(uint)(iVar33 < auVar30._8_4_);
      auVar73._12_4_ = -(uint)(iVar34 < auVar30._12_4_);
      auVar42._4_4_ = iVar71;
      auVar42._0_4_ = iVar71;
      auVar42._8_4_ = iVar85;
      auVar42._12_4_ = iVar85;
      auVar52._4_4_ = -(uint)(auVar30._4_4_ == iVar70);
      auVar52._12_4_ = -(uint)(auVar30._12_4_ == iVar34);
      auVar52._0_4_ = auVar52._4_4_;
      auVar52._8_4_ = auVar52._12_4_;
      auVar73._0_4_ = auVar73._4_4_;
      auVar73._8_4_ = auVar73._12_4_;
      auVar30 = auVar52 & auVar42 | auVar73;
      auVar30 = packssdw(auVar30,auVar30);
      auVar30 = packssdw(auVar30 ^ auVar94,auVar30 ^ auVar94);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        (&pNVar8[10].mark)[lVar12] = false;
      }
      auVar35 = pshufhw(auVar42,auVar42,0x84);
      auVar48 = pshufhw(auVar52,auVar52,0x84);
      auVar36 = pshufhw(auVar35,auVar73,0x84);
      auVar35 = (auVar36 | auVar48 & auVar35) ^ auVar94;
      auVar35 = packssdw(auVar35,auVar35);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35._10_2_ >> 8 & 1) != 0) {
        (&pNVar8[0xb].mark)[lVar12] = false;
      }
      auVar35 = auVar26 ^ auVar95;
      iVar71 = -(uint)(iVar69 < auVar35._0_4_);
      auVar44._4_4_ = -(uint)(iVar70 < auVar35._4_4_);
      iVar85 = -(uint)(iVar33 < auVar35._8_4_);
      auVar44._12_4_ = -(uint)(iVar34 < auVar35._12_4_);
      auVar53._4_4_ = iVar71;
      auVar53._0_4_ = iVar71;
      auVar53._8_4_ = iVar85;
      auVar53._12_4_ = iVar85;
      auVar30 = pshuflw(auVar30,auVar53,0xe8);
      auVar43._4_4_ = -(uint)(auVar35._4_4_ == iVar70);
      auVar43._12_4_ = -(uint)(auVar35._12_4_ == iVar34);
      auVar43._0_4_ = auVar43._4_4_;
      auVar43._8_4_ = auVar43._12_4_;
      auVar36 = pshuflw(auVar94,auVar43,0xe8);
      auVar44._0_4_ = auVar44._4_4_;
      auVar44._8_4_ = auVar44._12_4_;
      auVar35 = pshuflw(auVar30,auVar44,0xe8);
      in_XMM14._8_4_ = 0xffffffff;
      in_XMM14._0_8_ = 0xffffffffffffffff;
      in_XMM14._12_4_ = 0xffffffff;
      auVar30 = (auVar35 | auVar36 & auVar30) ^ in_XMM14;
      auVar30 = packssdw(auVar30,auVar30);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        (&pNVar8[0xc].mark)[lVar12] = false;
      }
      auVar44 = auVar43 & auVar53 | auVar44;
      auVar30 = packssdw(auVar44,auVar44);
      auVar30 = packssdw(auVar30 ^ in_XMM14,auVar30 ^ in_XMM14);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30._12_2_ >> 8 & 1) != 0) {
        (&pNVar8[0xd].mark)[lVar12] = false;
      }
      auVar30 = auVar28 ^ auVar95;
      auVar74._0_4_ = -(uint)(iVar69 < auVar30._0_4_);
      auVar74._4_4_ = -(uint)(iVar70 < auVar30._4_4_);
      auVar74._8_4_ = -(uint)(iVar33 < auVar30._8_4_);
      auVar74._12_4_ = -(uint)(iVar34 < auVar30._12_4_);
      auVar45._4_4_ = auVar74._0_4_;
      auVar45._0_4_ = auVar74._0_4_;
      auVar45._8_4_ = auVar74._8_4_;
      auVar45._12_4_ = auVar74._8_4_;
      iVar69 = -(uint)(auVar30._4_4_ == iVar70);
      iVar70 = -(uint)(auVar30._12_4_ == iVar34);
      auVar31._4_4_ = iVar69;
      auVar31._0_4_ = iVar69;
      auVar31._8_4_ = iVar70;
      auVar31._12_4_ = iVar70;
      auVar54._4_4_ = auVar74._4_4_;
      auVar54._0_4_ = auVar74._4_4_;
      auVar54._8_4_ = auVar74._12_4_;
      auVar54._12_4_ = auVar74._12_4_;
      in_XMM13 = auVar31 & auVar45 | auVar54;
      auVar30 = packssdw(auVar74,in_XMM13);
      auVar30 = packssdw(auVar30 ^ in_XMM14,auVar30 ^ in_XMM14);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        (&pNVar8[0xe].mark)[lVar12] = false;
      }
      auVar35 = pshufhw(auVar45,auVar45,0x84);
      auVar30 = pshufhw(auVar31,auVar31,0x84);
      auVar36 = pshufhw(auVar35,auVar54,0x84);
      auVar30 = packssdw(auVar30 & auVar35,(auVar36 | auVar30 & auVar35) ^ in_XMM14);
      auVar30 = packsswb(auVar30,auVar30);
      if ((auVar30._14_2_ >> 8 & 1) != 0) {
        (&pNVar8[0xf].mark)[lVar12] = false;
      }
      lVar15 = auVar46._8_8_;
      auVar46._0_8_ = auVar46._0_8_ + 0x10;
      auVar46._8_8_ = lVar15 + 0x10;
      lVar15 = auVar55._8_8_;
      auVar55._0_8_ = auVar55._0_8_ + 0x10;
      auVar55._8_8_ = lVar15 + 0x10;
      lVar15 = auVar59._8_8_;
      auVar59._0_8_ = auVar59._0_8_ + 0x10;
      auVar59._8_8_ = lVar15 + 0x10;
      lVar15 = auVar77._8_8_;
      auVar77._0_8_ = auVar77._0_8_ + 0x10;
      auVar77._8_8_ = lVar15 + 0x10;
      lVar15 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 0x10;
      auVar22._8_8_ = lVar15 + 0x10;
      lVar15 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 0x10;
      auVar24._8_8_ = lVar15 + 0x10;
      lVar15 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 0x10;
      auVar26._8_8_ = lVar15 + 0x10;
      lVar15 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 0x10;
      auVar28._8_8_ = lVar15 + 0x10;
      lVar12 = lVar12 + 0x140;
    } while ((ulong)(iVar84 + 0xfU >> 4) * 0x140 != lVar12);
  }
  uVar7 = local_40->next;
  if ((int)uVar7 < 0) {
LAB_001581be:
    this->index = 0;
    this->stack = -1;
    iVar69 = this->sz;
    uVar7 = iVar84 + iVar69;
    if (uVar7 != 0 && SCARRY4(iVar84,iVar69) == (int)uVar7 < 0) {
      uVar9 = (ulong)(uVar7 + 0xf & 0xfffffff0);
      lVar12 = (ulong)uVar7 - 1;
      auVar17._8_4_ = (int)lVar12;
      auVar17._0_8_ = lVar12;
      auVar17._12_4_ = (int)((ulong)lVar12 >> 0x20);
      pbVar11 = &this->var_nodes[0xf].mark;
      auVar32._8_4_ = 0xffffffff;
      auVar32._0_8_ = 0xffffffffffffffff;
      auVar32._12_4_ = 0xffffffff;
      auVar18 = _DAT_001d8640;
      auVar19 = _DAT_001d8650;
      auVar20 = _DAT_001d8660;
      auVar21 = _DAT_001d8670;
      auVar23 = _DAT_001d8680;
      auVar25 = _DAT_001d8690;
      auVar27 = _DAT_001d8190;
      auVar29 = _DAT_001d4960;
      do {
        auVar46 = auVar17 ^ auVar95;
        auVar55 = auVar29 ^ auVar95;
        iVar84 = auVar46._0_4_;
        iVar71 = -(uint)(iVar84 < auVar55._0_4_);
        iVar70 = auVar46._4_4_;
        auVar57._4_4_ = -(uint)(iVar70 < auVar55._4_4_);
        iVar33 = auVar46._8_4_;
        iVar85 = -(uint)(iVar33 < auVar55._8_4_);
        iVar34 = auVar46._12_4_;
        auVar57._12_4_ = -(uint)(iVar34 < auVar55._12_4_);
        auVar75._4_4_ = iVar71;
        auVar75._0_4_ = iVar71;
        auVar75._8_4_ = iVar85;
        auVar75._12_4_ = iVar85;
        auVar46 = pshuflw(in_XMM14,auVar75,0xe8);
        auVar56._4_4_ = -(uint)(auVar55._4_4_ == iVar70);
        auVar56._12_4_ = -(uint)(auVar55._12_4_ == iVar34);
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        auVar55 = pshuflw(auVar95,auVar56,0xe8);
        auVar57._0_4_ = auVar57._4_4_;
        auVar57._8_4_ = auVar57._12_4_;
        auVar95 = pshuflw(auVar46,auVar57,0xe8);
        auVar95 = (auVar95 | auVar55 & auVar46) ^ auVar32;
        auVar95 = packssdw(auVar95,auVar95);
        if ((auVar95 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar11[-300] = false;
        }
        auVar57 = auVar56 & auVar75 | auVar57;
        auVar95 = packssdw(auVar57,auVar57);
        auVar95 = packssdw(auVar95 ^ auVar32,auVar95 ^ auVar32);
        auVar95 = packsswb(auVar95,auVar95);
        if ((auVar95._0_4_ >> 8 & 1) != 0) {
          pbVar11[-0x118] = false;
        }
        auVar95 = _DAT_001d4970;
        auVar46 = auVar27 ^ _DAT_001d4970;
        iVar71 = -(uint)(iVar84 < auVar46._0_4_);
        auVar87._4_4_ = -(uint)(iVar70 < auVar46._4_4_);
        iVar85 = -(uint)(iVar33 < auVar46._8_4_);
        auVar87._12_4_ = -(uint)(iVar34 < auVar46._12_4_);
        auVar58._4_4_ = iVar71;
        auVar58._0_4_ = iVar71;
        auVar58._8_4_ = iVar85;
        auVar58._12_4_ = iVar85;
        auVar76._4_4_ = -(uint)(auVar46._4_4_ == iVar70);
        auVar76._12_4_ = -(uint)(auVar46._12_4_ == iVar34);
        auVar76._0_4_ = auVar76._4_4_;
        auVar76._8_4_ = auVar76._12_4_;
        auVar87._0_4_ = auVar87._4_4_;
        auVar87._8_4_ = auVar87._12_4_;
        auVar46 = auVar76 & auVar58 | auVar87;
        auVar46 = packssdw(auVar46,auVar46);
        auVar46 = packssdw(auVar46 ^ auVar32,auVar46 ^ auVar32);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._0_4_ >> 0x10 & 1) != 0) {
          pbVar11[-0x104] = false;
        }
        auVar55 = pshufhw(auVar58,auVar58,0x84);
        auVar77 = pshufhw(auVar76,auVar76,0x84);
        auVar59 = pshufhw(auVar55,auVar87,0x84);
        auVar55 = (auVar59 | auVar77 & auVar55) ^ auVar32;
        auVar55 = packssdw(auVar55,auVar55);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._0_4_ >> 0x18 & 1) != 0) {
          pbVar11[-0xf0] = false;
        }
        auVar55 = auVar25 ^ auVar95;
        iVar71 = -(uint)(iVar84 < auVar55._0_4_);
        auVar61._4_4_ = -(uint)(iVar70 < auVar55._4_4_);
        iVar85 = -(uint)(iVar33 < auVar55._8_4_);
        auVar61._12_4_ = -(uint)(iVar34 < auVar55._12_4_);
        auVar78._4_4_ = iVar71;
        auVar78._0_4_ = iVar71;
        auVar78._8_4_ = iVar85;
        auVar78._12_4_ = iVar85;
        auVar46 = pshuflw(auVar46,auVar78,0xe8);
        auVar60._4_4_ = -(uint)(auVar55._4_4_ == iVar70);
        auVar60._12_4_ = -(uint)(auVar55._12_4_ == iVar34);
        auVar60._0_4_ = auVar60._4_4_;
        auVar60._8_4_ = auVar60._12_4_;
        auVar55 = pshuflw(auVar95,auVar60,0xe8);
        auVar61._0_4_ = auVar61._4_4_;
        auVar61._8_4_ = auVar61._12_4_;
        auVar95 = pshuflw(auVar46,auVar61,0xe8);
        auVar95 = (auVar95 | auVar55 & auVar46) ^ auVar32;
        auVar95 = packssdw(auVar95,auVar95);
        auVar95 = packsswb(auVar95,auVar95);
        if ((auVar95 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar11[-0xdc] = false;
        }
        auVar61 = auVar60 & auVar78 | auVar61;
        auVar95 = packssdw(auVar61,auVar61);
        auVar95 = packssdw(auVar95 ^ auVar32,auVar95 ^ auVar32);
        auVar95 = packsswb(auVar95,auVar95);
        if ((auVar95._4_2_ >> 8 & 1) != 0) {
          pbVar11[-200] = false;
        }
        auVar95 = _DAT_001d4970;
        auVar46 = auVar23 ^ _DAT_001d4970;
        iVar71 = -(uint)(iVar84 < auVar46._0_4_);
        auVar88._4_4_ = -(uint)(iVar70 < auVar46._4_4_);
        iVar85 = -(uint)(iVar33 < auVar46._8_4_);
        auVar88._12_4_ = -(uint)(iVar34 < auVar46._12_4_);
        auVar62._4_4_ = iVar71;
        auVar62._0_4_ = iVar71;
        auVar62._8_4_ = iVar85;
        auVar62._12_4_ = iVar85;
        auVar79._4_4_ = -(uint)(auVar46._4_4_ == iVar70);
        auVar79._12_4_ = -(uint)(auVar46._12_4_ == iVar34);
        auVar79._0_4_ = auVar79._4_4_;
        auVar79._8_4_ = auVar79._12_4_;
        auVar88._0_4_ = auVar88._4_4_;
        auVar88._8_4_ = auVar88._12_4_;
        auVar46 = auVar79 & auVar62 | auVar88;
        auVar46 = packssdw(auVar46,auVar46);
        auVar46 = packssdw(auVar46 ^ auVar32,auVar46 ^ auVar32);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar11[-0xb4] = false;
        }
        auVar55 = pshufhw(auVar62,auVar62,0x84);
        auVar77 = pshufhw(auVar79,auVar79,0x84);
        auVar59 = pshufhw(auVar55,auVar88,0x84);
        auVar55 = (auVar59 | auVar77 & auVar55) ^ auVar32;
        auVar55 = packssdw(auVar55,auVar55);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._6_2_ >> 8 & 1) != 0) {
          pbVar11[-0xa0] = false;
        }
        auVar55 = auVar21 ^ auVar95;
        iVar71 = -(uint)(iVar84 < auVar55._0_4_);
        auVar64._4_4_ = -(uint)(iVar70 < auVar55._4_4_);
        iVar85 = -(uint)(iVar33 < auVar55._8_4_);
        auVar64._12_4_ = -(uint)(iVar34 < auVar55._12_4_);
        auVar80._4_4_ = iVar71;
        auVar80._0_4_ = iVar71;
        auVar80._8_4_ = iVar85;
        auVar80._12_4_ = iVar85;
        auVar46 = pshuflw(auVar46,auVar80,0xe8);
        auVar63._4_4_ = -(uint)(auVar55._4_4_ == iVar70);
        auVar63._12_4_ = -(uint)(auVar55._12_4_ == iVar34);
        auVar63._0_4_ = auVar63._4_4_;
        auVar63._8_4_ = auVar63._12_4_;
        auVar55 = pshuflw(auVar95,auVar63,0xe8);
        auVar64._0_4_ = auVar64._4_4_;
        auVar64._8_4_ = auVar64._12_4_;
        auVar95 = pshuflw(auVar46,auVar64,0xe8);
        auVar95 = (auVar95 | auVar55 & auVar46) ^ auVar32;
        auVar95 = packssdw(auVar95,auVar95);
        auVar95 = packsswb(auVar95,auVar95);
        if ((auVar95 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar11[-0x8c] = false;
        }
        auVar64 = auVar63 & auVar80 | auVar64;
        auVar95 = packssdw(auVar64,auVar64);
        auVar95 = packssdw(auVar95 ^ auVar32,auVar95 ^ auVar32);
        auVar95 = packsswb(auVar95,auVar95);
        if ((auVar95._8_2_ >> 8 & 1) != 0) {
          pbVar11[-0x78] = false;
        }
        auVar95 = _DAT_001d4970;
        auVar46 = auVar20 ^ _DAT_001d4970;
        iVar71 = -(uint)(iVar84 < auVar46._0_4_);
        auVar89._4_4_ = -(uint)(iVar70 < auVar46._4_4_);
        iVar85 = -(uint)(iVar33 < auVar46._8_4_);
        auVar89._12_4_ = -(uint)(iVar34 < auVar46._12_4_);
        auVar65._4_4_ = iVar71;
        auVar65._0_4_ = iVar71;
        auVar65._8_4_ = iVar85;
        auVar65._12_4_ = iVar85;
        auVar81._4_4_ = -(uint)(auVar46._4_4_ == iVar70);
        auVar81._12_4_ = -(uint)(auVar46._12_4_ == iVar34);
        auVar81._0_4_ = auVar81._4_4_;
        auVar81._8_4_ = auVar81._12_4_;
        auVar89._0_4_ = auVar89._4_4_;
        auVar89._8_4_ = auVar89._12_4_;
        auVar46 = auVar81 & auVar65 | auVar89;
        auVar46 = packssdw(auVar46,auVar46);
        auVar46 = packssdw(auVar46 ^ auVar32,auVar46 ^ auVar32);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pbVar11[-100] = false;
        }
        auVar55 = pshufhw(auVar65,auVar65,0x84);
        auVar77 = pshufhw(auVar81,auVar81,0x84);
        auVar59 = pshufhw(auVar55,auVar89,0x84);
        auVar55 = (auVar59 | auVar77 & auVar55) ^ auVar32;
        auVar55 = packssdw(auVar55,auVar55);
        auVar55 = packsswb(auVar55,auVar55);
        if ((auVar55._10_2_ >> 8 & 1) != 0) {
          pbVar11[-0x50] = false;
        }
        auVar55 = auVar19 ^ auVar95;
        iVar71 = -(uint)(iVar84 < auVar55._0_4_);
        auVar67._4_4_ = -(uint)(iVar70 < auVar55._4_4_);
        iVar85 = -(uint)(iVar33 < auVar55._8_4_);
        auVar67._12_4_ = -(uint)(iVar34 < auVar55._12_4_);
        auVar82._4_4_ = iVar71;
        auVar82._0_4_ = iVar71;
        auVar82._8_4_ = iVar85;
        auVar82._12_4_ = iVar85;
        auVar46 = pshuflw(auVar46,auVar82,0xe8);
        auVar66._4_4_ = -(uint)(auVar55._4_4_ == iVar70);
        auVar66._12_4_ = -(uint)(auVar55._12_4_ == iVar34);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar55 = pshuflw(auVar95,auVar66,0xe8);
        auVar67._0_4_ = auVar67._4_4_;
        auVar67._8_4_ = auVar67._12_4_;
        auVar95 = pshuflw(auVar46,auVar67,0xe8);
        auVar95 = (auVar95 | auVar55 & auVar46) ^ auVar32;
        auVar95 = packssdw(auVar95,auVar95);
        auVar95 = packsswb(auVar95,auVar95);
        if ((auVar95 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar11[-0x3c] = false;
        }
        auVar67 = auVar66 & auVar82 | auVar67;
        auVar95 = packssdw(auVar67,auVar67);
        auVar95 = packssdw(auVar95 ^ auVar32,auVar95 ^ auVar32);
        auVar95 = packsswb(auVar95,auVar95);
        if ((auVar95._12_2_ >> 8 & 1) != 0) {
          pbVar11[-0x28] = false;
        }
        auVar95 = _DAT_001d4970;
        auVar46 = auVar18 ^ _DAT_001d4970;
        auVar90._0_4_ = -(uint)(iVar84 < auVar46._0_4_);
        auVar90._4_4_ = -(uint)(iVar70 < auVar46._4_4_);
        auVar90._8_4_ = -(uint)(iVar33 < auVar46._8_4_);
        auVar90._12_4_ = -(uint)(iVar34 < auVar46._12_4_);
        auVar68._4_4_ = auVar90._0_4_;
        auVar68._0_4_ = auVar90._0_4_;
        auVar68._8_4_ = auVar90._8_4_;
        auVar68._12_4_ = auVar90._8_4_;
        iVar84 = -(uint)(auVar46._4_4_ == iVar70);
        iVar70 = -(uint)(auVar46._12_4_ == iVar34);
        auVar47._4_4_ = iVar84;
        auVar47._0_4_ = iVar84;
        auVar47._8_4_ = iVar70;
        auVar47._12_4_ = iVar70;
        auVar83._4_4_ = auVar90._4_4_;
        auVar83._0_4_ = auVar90._4_4_;
        auVar83._8_4_ = auVar90._12_4_;
        auVar83._12_4_ = auVar90._12_4_;
        in_XMM14 = auVar47 & auVar68 | auVar83;
        auVar46 = packssdw(auVar90,in_XMM14);
        auVar46 = packssdw(auVar46 ^ auVar32,auVar46 ^ auVar32);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar11[-0x14] = false;
        }
        auVar55 = pshufhw(auVar68,auVar68,0x84);
        auVar46 = pshufhw(auVar47,auVar47,0x84);
        auVar59 = pshufhw(auVar55,auVar83,0x84);
        auVar46 = packssdw(auVar46 & auVar55,(auVar59 | auVar46 & auVar55) ^ auVar32);
        auVar46 = packsswb(auVar46,auVar46);
        if ((auVar46._14_2_ >> 8 & 1) != 0) {
          *pbVar11 = false;
        }
        lVar12 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 0x10;
        auVar29._8_8_ = lVar12 + 0x10;
        lVar12 = auVar27._8_8_;
        auVar27._0_8_ = auVar27._0_8_ + 0x10;
        auVar27._8_8_ = lVar12 + 0x10;
        lVar12 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 0x10;
        auVar25._8_8_ = lVar12 + 0x10;
        lVar12 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 0x10;
        auVar23._8_8_ = lVar12 + 0x10;
        lVar12 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 0x10;
        auVar21._8_8_ = lVar12 + 0x10;
        lVar12 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + 0x10;
        auVar20._8_8_ = lVar12 + 0x10;
        lVar12 = auVar19._8_8_;
        auVar19._0_8_ = auVar19._0_8_ + 0x10;
        auVar19._8_8_ = lVar12 + 0x10;
        lVar12 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 0x10;
        auVar18._8_8_ = lVar12 + 0x10;
        pbVar11 = pbVar11 + 0x140;
        uVar9 = uVar9 - 0x10;
      } while (uVar9 != 0);
    }
    if (0 < iVar69) {
      lVar15 = 0x11;
      lVar12 = 0;
      do {
        if (*(char *)((long)&this->var_nodes->next + lVar15) == '\0') {
          bVar6 = tarjan(this,(int)lVar12);
          if (!bVar6) {
            return false;
          }
          iVar69 = this->sz;
        }
        lVar12 = lVar12 + 1;
        lVar15 = lVar15 + 0x14;
      } while (lVar12 < iVar69);
    }
    return true;
  }
  pIVar1 = this->x;
LAB_00158050:
  pNVar10 = this->var_nodes;
  pNVar2 = this->val_nodes;
  pNVar8 = local_40;
LAB_0015805b:
  pIVar3 = pIVar1[uVar7].var;
  uVar13 = (pIVar3->min).v;
  pNVar4 = this->var_nodes;
LAB_00158079:
  uVar9 = (ulong)uVar13;
  lVar12 = (long)(int)uVar13;
  if (pNVar2[lVar12].mark == false) {
    iVar84 = pNVar2[lVar12].match.v;
    if ((long)iVar84 < 0) goto LAB_0015810b;
    pNVar2[lVar12].mark = true;
    pNVar2[lVar12].next = uVar7;
    pNVar8->next = iVar84;
    pNVar8 = pNVar4 + iVar84;
  }
  if (uVar13 == (pIVar3->max).v) goto LAB_001580e2;
  lVar15 = 0;
  do {
    lVar5 = lVar15 + lVar12 + 1;
    lVar15 = lVar15 + 1;
  } while (pIVar3->vals[lVar5].v == '\0');
  uVar13 = uVar13 + (int)lVar15;
  if (-0x80000000 - lVar12 == lVar15) goto LAB_001580e2;
  goto LAB_00158079;
LAB_0015810b:
  this->queue_tail = &pNVar8->next;
  pNVar8 = this->val_nodes;
  while( true ) {
    iVar84 = (int)uVar9;
    uVar9 = (ulong)this->var_nodes[(int)uVar7].match.v;
    pTVar14 = &pNVar8[iVar84].match;
    local_50.x = pTVar14->v;
    local_50.sz = 4;
    local_50.pt = &pTVar14->v;
    vec<TrailElem>::push(&engine.trail,&local_50);
    pTVar14->v = uVar7;
    pTVar14 = &this->var_nodes[(int)uVar7].match;
    local_50.x = pTVar14->v;
    local_50.sz = 4;
    local_50.pt = &pTVar14->v;
    vec<TrailElem>::push(&engine.trail,&local_50);
    pTVar14->v = iVar84;
    if ((long)uVar9 < 0) break;
    pNVar8 = this->val_nodes;
    uVar7 = pNVar8[uVar9].next;
  }
  goto LAB_00157a30;
LAB_001580e2:
  uVar7 = pNVar10[uVar7].next;
  if ((int)uVar7 < 0) goto code_r0x001580f5;
  goto LAB_0015805b;
code_r0x001580f5:
  pNVar8->next = -1;
  uVar7 = local_40->next;
  if ((int)uVar7 < 0) {
    this->queue_tail = &pNVar8->next;
    iVar84 = this->range;
    goto LAB_001581be;
  }
  goto LAB_00158050;
}

Assistant:

bool propagate() override {
		// fprintf(stderr, "AllDiffDomain::propagate()\n");
		//  Edmonds-Karp, loop to find and augment a path
		while (true) {
			int var;
			int val;

			// visit source
			queue_tail = &queue;
			for (int i = 0; i < sz; ++i) {
				if (var_nodes[i].match < 0) {
					*queue_tail = i;
					queue_tail = &var_nodes[i].next;
				}
			}
			*queue_tail = -1;
			for (int i = 0; i < range; ++i) {
				val_nodes[i].mark = false;
			}

			// visit vars, also subsume visit of vals
			while (queue >= 0) {
				queue_tail = &queue;
				for (var = queue; var >= 0; var = var_nodes[var].next) {
					for (typename IntView<U>::iterator i = x[var].begin(); i != x[var].end(); ++i) {
						val = *i;
						if (!val_nodes[val].mark) {
							assert(val != var_nodes[var].match);
							const int next_var = val_nodes[val].match;
							if (next_var < 0) {
								goto augment;
							}

							val_nodes[val].mark = true;
							val_nodes[val].next = var;
							*queue_tail = next_var;
							queue_tail = &var_nodes[next_var].next;
						}
					}
				}
				*queue_tail = -1;
			}

			// no more augmenting paths
			break;

		augment:
			// found an augmenting path
			while (true) {
				const int parent_val = var_nodes[var].match;
				val_nodes[val].match = var;
				var_nodes[var].match = val;
				if (parent_val < 0) {
					break;
				}
				val = parent_val;
				var = val_nodes[val].next;
			}
		}
		// fprintf(stderr, "match");
		// for (int i = 0; i < sz; ++i)
		//  fprintf(stderr, " %d", var_nodes[i].match);
		// fprintf(stderr, "\n");

		index = 0;
		stack = -1;
		for (int i = 0; i < sz + range; ++i) {
			var_nodes[i].mark = false;
		}
		for (int i = 0; i < sz; ++i) {
			if (!var_nodes[i].mark && !tarjan(i)) {
				return false;
			}
		}

		return true;
	}